

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_end(Parser *parser)

{
  Kind KVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  List *args_00;
  Token *pTVar6;
  void *pvVar7;
  KindMeta KVar8;
  List *args;
  void *expr;
  void **p;
  EndTerm *end;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  parser_local = (Parser *)parse_constant(parser);
  end = (EndTerm *)parser->token;
  KVar1 = ((Token *)end)->kind;
  if (KVar1 == AND) {
    parser_local = (Parser *)new_end_term((Token *)end,parser_local);
  }
  else if (KVar1 == OP_BRA) {
    move(parser);
    args_00 = new_list();
    while (parser->token->kind != CL_BRA) {
      pvVar7 = parse_expr(parser);
      list_add(args_00,pvVar7);
      move(parser);
      if (parser->token->kind == COMM) {
        move(parser);
      }
      else if (parser->token->kind != CL_BRA) {
        log_debug(
                 "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:666"
                 );
        pcVar5 = parser->lexer->source;
        uVar3 = parser->token->row_pos;
        uVar4 = parser->token->col_pos;
        KVar8 = get_kind_meta(((Token *)end)->kind);
        log_code(pcVar5,uVar3,uVar4,"Illegal expression: %s",KVar8.name);
      }
    }
    expect(parser,CL_BRA);
    parser_local = (Parser *)new_call_term(parser_local,args_00);
  }
  else if (KVar1 == OP_SQ_BRA) {
    move(parser);
    pvVar7 = parse_expr(parser);
    expect(parser,CL_FL_BRA);
    parser_local = (Parser *)new_array_subscript(parser_local,pvVar7);
  }
  else if ((KVar1 == SUB2) || (KVar1 == AND2)) {
    p = (void **)0x0;
    while( true ) {
      while ((iVar2 = *(int *)&(end->node).eval, iVar2 == 0xaf || (iVar2 == 0xb9))) {
        end = (EndTerm *)parser->token;
        move(parser);
        if (p == (void **)0x0) {
          p = (void **)new_end_term((Token *)end,(void *)0x0);
          expr = ((EndTerm *)p)->expr;
        }
        else {
          p = (void **)new_end_term((Token *)end,p);
        }
      }
      if (p == (void **)0x0) break;
      *(Parser **)expr = parser_local;
    }
    parser_local = (Parser *)p;
  }
  else if (KVar1 == DO) {
    move(parser);
    pTVar6 = peek(parser);
    if (pTVar6->kind != ID) {
      log_debug(
               "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:676"
               );
      pcVar5 = parser->lexer->source;
      uVar3 = parser->token->row_pos;
      uVar4 = parser->token->col_pos;
      KVar8 = get_kind_meta(((Token *)end)->kind);
      log_code(pcVar5,uVar3,uVar4,"Illegal expression: %s",KVar8.name);
    }
    pvVar7 = parse_expr(parser);
    parser_local = (Parser *)new_select_member(parser_local,pvVar7);
  }
  return parser_local;
}

Assistant:

void *parse_end(Parser *parser) {
    void *left = parse_constant(parser);
    Token *tok = token(parser);
    switch (g_kind(tok)) {
        case AND2:
        case SUB2: {
            // ++, ----
            EndTerm *end = NULL;
            void **p;
            while (true) {
                switch (g_kind(tok)) {
                    case AND2:
                    case SUB2:
                        tok = token(parser);
                        move(parser);
                        if (end == NULL) {
                            end = new_end_term(tok, NULL);
                            p = end->expr;
                        } else {
                            end = new_end_term(tok, end);
                        }
                        continue;
                    default:
                        break;
                }
                if (end != NULL) {
                    *p = left;
                } else {
                    break;
                }
            }
            return end;
        }
        case AND:
            return new_end_term(tok, left);
        case OP_SQ_BRA: {
            move(parser);
            void *expr = parse_expr(parser);
            expect(parser, CL_FL_BRA);
            return new_array_subscript(left, expr);
        }
        case OP_BRA: {
            move(parser);
            List *args = new_list();
            while (token(parser)->kind != CL_BRA) {
                list_add(args, parse_expr(parser));
                move(parser);
                if (token(parser)->kind == COMM) {
                    move(parser);
                    continue;
                }
                if (token(parser)->kind != CL_BRA) {
                    
                    parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
                }
            }
            expect(parser, CL_BRA);
            return new_call_term(left, args);
        }
        case DO: {
            move(parser);
            if (peek(parser)->kind != ID) {
                
                parse_error(parser, "Illegal expression: %s", get_kind_meta(tok->kind).name);
            }
            return new_select_member(left, parse_expr(parser));
        }
        default:
            return left;
    }
}